

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O3

void chaiscript::bootstrap::standard_library::
     sequence_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
               (string *param_1,Module *m)

{
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_80;
  code *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_28;
  
  local_70 = detail::
             insert_at<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
  ;
  dispatch::detail::
  make_callable_impl<void(*)(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,int,chaiscript::Boxed_Value_const&),false,false,false,false,void,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,int,chaiscript::Boxed_Value_const&>
            (&local_28);
  local_48.field_2._M_allocated_capacity._0_5_ = 0x7265736e69;
  local_48.field_2._M_allocated_capacity._5_3_ = 0x725f74;
  local_48.field_2._8_5_ = 0x74615f6665;
  local_48._M_string_length = 0xd;
  local_48.field_2._M_local_buf[0xd] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&m->m_funcs,&local_28,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT35(local_48.field_2._M_allocated_capacity._5_3_,
                             local_48.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if (local_28.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_70 = detail::
             erase_at<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>;
  dispatch::detail::
  make_callable_impl<void(*)(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,int),false,false,false,false,void,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,int>
            (&local_80);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"erase_at","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&m->m_funcs,&local_80,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_80.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void sequence_type(const std::string & /*type*/, Module &m) {
    m.add(fun(&detail::insert_at<ContainerType>), []() -> std::string {
      if (typeid(typename ContainerType::value_type) == typeid(Boxed_Value)) {
        return "insert_ref_at";
      } else {
        return "insert_at";
      }
    }());

    m.add(fun(&detail::erase_at<ContainerType>), "erase_at");
  }